

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

EventLoop * __thiscall Liby::EventLoop::robinLoop(EventLoop *this,int fd)

{
  EventLoop *pEVar1;
  int local_4;
  
  if ((this->rf_).super__Function_base._M_manager != (_Manager_type)0x0) {
    pEVar1 = (*(this->rf_)._M_invoker)((_Any_data *)&this->rf_,&local_4);
    return pEVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

EventLoop *EventLoop::robinLoop(int fd) { return rf_(fd); }